

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void sym_Purge(char *symName)

{
  bool bVar1;
  Symbol *sym_00;
  Symbol *sym;
  char *symName_local;
  
  sym_00 = sym_FindScopedValidSymbol(symName);
  if (sym_00 == (Symbol *)0x0) {
    error("\'%s\' not defined\n",symName);
  }
  else if ((sym_00->isBuiltin & 1U) == 0) {
    bVar1 = isReferenced(sym_00);
    if (bVar1) {
      error("Symbol \"%s\" is referenced and thus cannot be purged\n",symName);
    }
    else {
      if (sym_00 == (Symbol *)labelScope) {
        sym_SetCurrentSymbolScope((char *)0x0);
      }
      hash_RemoveElement(symbols,sym_00->name);
      free(sym_00);
    }
  }
  else {
    error("Built-in symbol \'%s\' cannot be purged\n",symName);
  }
  return;
}

Assistant:

void sym_Purge(char const *symName)
{
	struct Symbol *sym = sym_FindScopedValidSymbol(symName);

	if (!sym) {
		error("'%s' not defined\n", symName);
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be purged\n", symName);
	} else if (isReferenced(sym)) {
		error("Symbol \"%s\" is referenced and thus cannot be purged\n", symName);
	} else {
		// Do not keep a reference to the label's name after purging it
		if (sym->name == labelScope)
			sym_SetCurrentSymbolScope(NULL);

		// FIXME: this leaks sym->macro for SYM_EQUS and SYM_MACRO, but this can't
		// free(sym->macro) because the expansion may be purging itself.
		hash_RemoveElement(symbols, sym->name);
		// TODO: ideally, also unref the file stack nodes
		free(sym);
	}
}